

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O3

int nng_socket_proto_name(nng_socket id,char **name)

{
  int iVar1;
  char *pcVar2;
  nni_sock *local_20;
  nni_sock *sock;
  
  iVar1 = nni_sock_find(&local_20,id.id);
  if (iVar1 == 0) {
    pcVar2 = nni_sock_proto_name(local_20);
    *name = pcVar2;
    nni_sock_rele(local_20);
  }
  return iVar1;
}

Assistant:

int
nng_socket_proto_name(nng_socket id, const char **name)
{
	int       rv;
	nni_sock *sock;

	if ((rv = nni_sock_find(&sock, id.id)) != 0) {
		return (rv);
	}

	*name = nni_sock_proto_name(sock);
	nni_sock_rele(sock);
	return (0);
}